

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.cc
# Opt level: O2

ssize_t __thiscall Pl_ASCII85Decoder::write(Pl_ASCII85Decoder *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  Pipeline *pPVar2;
  size_t sVar3;
  int iVar4;
  ulong in_RAX;
  ulong extraout_RAX;
  undefined4 extraout_var;
  ulong extraout_RAX_00;
  runtime_error *this_00;
  size_t i;
  void *pvVar5;
  undefined4 in_register_00000034;
  ulong uStack_38;
  uchar zeroes [4];
  
  if (this->eod < 2) {
    uStack_38 = in_RAX;
    for (pvVar5 = (void *)0x0; __buf != pvVar5; pvVar5 = (void *)((long)pvVar5 + 1)) {
      bVar1 = *(byte *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar5);
      in_RAX = (ulong)bVar1;
      if ((0x20 < in_RAX) || ((0x100003e00U >> (in_RAX & 0x3f) & 1) == 0)) {
        if (1 < this->eod) {
          return in_RAX;
        }
        if (this->eod == 1) {
          if (bVar1 != 0x3e) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"broken end-of-data sequence in base 85 data")
            ;
LAB_0012a5bc:
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          flush(this);
          this->eod = 2;
          in_RAX = extraout_RAX;
        }
        else if (bVar1 == 0x7a) {
          if (this->pos != 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"unexpected z during base 85 decode");
            goto LAB_0012a5bc;
          }
          uStack_38 = uStack_38 & 0xffffffff;
          pPVar2 = (this->super_Pipeline).next_;
          iVar4 = (*pPVar2->_vptr_Pipeline[2])(pPVar2,zeroes,4);
          in_RAX = CONCAT44(extraout_var,iVar4);
        }
        else if (bVar1 == 0x7e) {
          this->eod = 1;
        }
        else {
          if ((byte)(bVar1 + 0x8a) < 0xab) {
            this->error = true;
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"character out of range during base 85 decode");
            goto LAB_0012a5bc;
          }
          sVar3 = this->pos;
          this->pos = sVar3 + 1;
          this->inbuf[sVar3] = bVar1;
          if (this->pos == 5) {
            flush(this);
            in_RAX = extraout_RAX_00;
          }
        }
      }
    }
  }
  return in_RAX;
}

Assistant:

void
Pl_ASCII85Decoder::write(unsigned char const* buf, size_t len)
{
    if (eod > 1) {
        return;
    }
    for (size_t i = 0; i < len; ++i) {
        switch (buf[i]) {
        case ' ':
        case '\f':
        case '\v':
        case '\t':
        case '\r':
        case '\n':
            QTC::TC("libtests", "Pl_ASCII85Decoder ignore space");
            // ignore whitespace
            continue;
        }
        if (eod > 1) {
            break;
        } else if (eod == 1) {
            if (buf[i] == '>') {
                flush();
                eod = 2;
            } else {
                throw std::runtime_error("broken end-of-data sequence in base 85 data");
            }
        } else {
            switch (buf[i]) {
            case '~':
                eod = 1;
                break;

            case 'z':
                if (pos != 0) {
                    throw std::runtime_error("unexpected z during base 85 decode");
                } else {
                    QTC::TC("libtests", "Pl_ASCII85Decoder read z");
                    unsigned char zeroes[4];
                    memset(zeroes, '\0', 4);
                    next()->write(zeroes, 4);
                }
                break;

            default:
                if ((buf[i] < 33) || (buf[i] > 117)) {
                    error = true;
                    throw std::runtime_error("character out of range during base 85 decode");
                } else {
                    this->inbuf[this->pos++] = buf[i];
                    if (pos == 5) {
                        flush();
                    }
                }
                break;
            }
        }
    }
}